

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O0

TRef lj_opt_narrow_convert(jit_State *J)

{
  int iVar1;
  long in_RDI;
  NarrowConv nc;
  NarrowConv *in_stack_fffffffffffffbf8;
  jit_State *in_stack_fffffffffffffc00;
  int in_stack_fffffffffffffc20;
  IRRef in_stack_fffffffffffffc24;
  NarrowConv *in_stack_fffffffffffffc28;
  IRRef local_4;
  
  if (((*(uint *)(in_RDI + 0x90) & 0x200000) == 0) ||
     (iVar1 = narrow_conv_backprop
                        (in_stack_fffffffffffffc28,in_stack_fffffffffffffc24,
                         in_stack_fffffffffffffc20), 1 < iVar1)) {
    local_4 = 0;
  }
  else {
    local_4 = narrow_conv_emit(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  }
  return local_4;
}

Assistant:

TRef LJ_FASTCALL lj_opt_narrow_convert(jit_State *J)
{
  if ((J->flags & JIT_F_OPT_NARROW)) {
    NarrowConv nc;
    nc.J = J;
    nc.sp = nc.stack;
    nc.maxsp = &nc.stack[NARROW_MAX_STACK-4];
    nc.t = irt_type(fins->t);
    if (fins->o == IR_TOBIT) {
      nc.mode = IRCONV_TOBIT;  /* Used only in the backpropagation cache. */
    } else {
      nc.mode = fins->op2;
    }
    if (narrow_conv_backprop(&nc, fins->op1, 0) <= 1)
      return narrow_conv_emit(J, &nc);
  }
  return NEXTFOLD;
}